

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferObjectQueryTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::anon_unknown_2::BufferCase::test(BufferCase *this)

{
  GLuint local_44;
  int local_40;
  GLuint bufferId;
  int ndx;
  int targets;
  GLenum bufferTargets [8];
  BufferCase *this_local;
  
  _ndx = 0x8f3600008892;
  bufferTargets[0] = 0x8c8e;
  bufferTargets[1] = 0x8a11;
  bufferTargets[2] = 0x8f37;
  bufferTargets[3] = 0x8893;
  bufferTargets[4] = 0x88eb;
  bufferTargets[5] = 0x88ec;
  bufferId = 4;
  if ((this->m_testAllTargets & 1U) != 0) {
    bufferId = 8;
  }
  for (local_40 = 0; local_40 < (int)bufferId; local_40 = local_40 + 1) {
    this->m_bufferTarget = (&ndx)[local_40];
    local_44 = 0;
    glu::CallLogWrapper::glGenBuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_44);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ApiCase).super_CallLogWrapper,this->m_bufferTarget,local_44);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6])();
    glu::CallLogWrapper::glDeleteBuffers(&(this->super_ApiCase).super_CallLogWrapper,1,&local_44);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		const GLenum bufferTargets[] =
		{
			GL_ARRAY_BUFFER, GL_COPY_READ_BUFFER,
			GL_TRANSFORM_FEEDBACK_BUFFER, GL_UNIFORM_BUFFER,

			GL_COPY_WRITE_BUFFER, GL_ELEMENT_ARRAY_BUFFER,
			GL_PIXEL_PACK_BUFFER, GL_PIXEL_UNPACK_BUFFER
		};

		// most test need only to be run with a subset of targets
		const int targets = m_testAllTargets ? DE_LENGTH_OF_ARRAY(bufferTargets) : 4;

		for (int ndx = 0; ndx < targets; ++ndx)
		{
			m_bufferTarget = bufferTargets[ndx];

			GLuint bufferId = 0;
			glGenBuffers(1, &bufferId);
			glBindBuffer(m_bufferTarget, bufferId);
			expectError(GL_NO_ERROR);

			testBuffer();

			glDeleteBuffers(1, &bufferId);
			expectError(GL_NO_ERROR);
		}
	}